

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-mqtt.c
# Opt level: O0

int lws_create_client_mqtt_object(lws_client_connect_info *i,lws *wsi)

{
  lws_mqtt_client_connect_param_t *plVar1;
  int iVar2;
  _lws_mqtt_related *p_Var3;
  lws_mqtt_str_t *plVar4;
  lws_mqtt_client_connect_param_t *cp;
  lws_mqttc_t *c;
  lws *wsi_local;
  lws_client_connect_info *i_local;
  
  plVar1 = i->mqtt_cp;
  p_Var3 = (_lws_mqtt_related *)lws_zalloc(0x100,"client mqtt struct");
  wsi->mqtt = p_Var3;
  if (wsi->mqtt == (_lws_mqtt_related *)0x0) goto LAB_0012965a;
  wsi->mqtt->wsi = wsi;
  p_Var3 = wsi->mqtt;
  iVar2 = lws_mqtt_generate_id(wsi,&(p_Var3->client).id,plVar1->client_id);
  if (iVar2 != 0) {
    _lws_log(1,"%s: Error generating client ID\n","lws_create_client_mqtt_object");
    return 1;
  }
  _lws_log(8,"%s: using client id \'%.*s\'\n","lws_create_client_mqtt_object",
           (ulong)((p_Var3->client).id)->len,((p_Var3->client).id)->buf);
  if ((plVar1->clean_start != '\0') || (*plVar1->client_id == '\0')) {
    (p_Var3->client).conn_flags = '\x02';
  }
  (p_Var3->client).keep_alive_secs = plVar1->keep_alive;
  if (((plVar1->will_param).topic == (char *)0x0) || (*(plVar1->will_param).topic == '\0')) {
LAB_00129558:
    if (plVar1->username == (char *)0x0) {
      return 0;
    }
    if (*plVar1->username == '\0') {
      return 0;
    }
    plVar4 = lws_mqtt_str_create_cstr_dup(plVar1->username,0);
    (p_Var3->client).username = plVar4;
    if ((p_Var3->client).username != (lws_mqtt_str_t *)0x0) {
      (p_Var3->client).conn_flags = (p_Var3->client).conn_flags | 0x80;
      if (plVar1->password == (char *)0x0) {
        return 0;
      }
      plVar4 = lws_mqtt_str_create_cstr_dup(plVar1->password,0);
      (p_Var3->client).password = plVar4;
      if ((p_Var3->client).password != (lws_mqtt_str_t *)0x0) {
        (p_Var3->client).conn_flags = (p_Var3->client).conn_flags | 0x40;
        return 0;
      }
      lws_mqtt_str_free(&(p_Var3->client).username);
    }
    lws_mqtt_str_free(&(p_Var3->client).will.message);
LAB_0012963a:
    lws_mqtt_str_free(&(p_Var3->client).will.topic);
  }
  else {
    plVar4 = lws_mqtt_str_create_cstr_dup((plVar1->will_param).topic,0);
    (p_Var3->client).will.topic = plVar4;
    if ((p_Var3->client).will.topic != (lws_mqtt_str_t *)0x0) {
      (p_Var3->client).conn_flags = (p_Var3->client).conn_flags | 4;
      if ((plVar1->will_param).message == (char *)0x0) {
LAB_0012950e:
        (p_Var3->client).conn_flags =
             (p_Var3->client).conn_flags |
             (byte)(((plVar1->will_param).qos & RESERVED_QOS_LEVEL) << 3);
        (p_Var3->client).conn_flags =
             (p_Var3->client).conn_flags | ((plVar1->will_param).retain != '\0') << 5;
        goto LAB_00129558;
      }
      plVar4 = lws_mqtt_str_create_cstr_dup((plVar1->will_param).message,0);
      (p_Var3->client).will.message = plVar4;
      if ((p_Var3->client).will.message != (lws_mqtt_str_t *)0x0) goto LAB_0012950e;
      goto LAB_0012963a;
    }
  }
  lws_mqtt_str_free(&(p_Var3->client).id);
LAB_0012965a:
  _lws_log(1,"%s: OOM!\n","lws_create_client_mqtt_object");
  return 1;
}

Assistant:

int
lws_create_client_mqtt_object(const struct lws_client_connect_info *i,
			      struct lws *wsi)
{
	lws_mqttc_t *c;
	const lws_mqtt_client_connect_param_t *cp = i->mqtt_cp;

	/* allocate the ws struct for the wsi */
	wsi->mqtt = lws_zalloc(sizeof(*wsi->mqtt), "client mqtt struct");
	if (!wsi->mqtt)
		goto oom;

	wsi->mqtt->wsi = wsi;
	c = &wsi->mqtt->client;

	if (lws_mqtt_generate_id(wsi, &c->id, cp->client_id)) {
		lwsl_err("%s: Error generating client ID\n", __func__);
		return 1;
	}
	lwsl_info("%s: using client id '%.*s'\n", __func__, c->id->len,
			(const char *)c->id->buf);

	if (cp->clean_start || !cp->client_id[0])
		c->conn_flags = LMQCFT_CLEAN_START;

	c->keep_alive_secs = cp->keep_alive;

	if (cp->will_param.topic &&
	    *cp->will_param.topic) {
		c->will.topic = lws_mqtt_str_create_cstr_dup(
						cp->will_param.topic, 0);
		if (!c->will.topic)
			goto oom1;
		c->conn_flags |= LMQCFT_WILL_FLAG;
		if (cp->will_param.message) {
			c->will.message = lws_mqtt_str_create_cstr_dup(
						cp->will_param.message, 0);
			if (!c->will.message)
				goto oom2;
		}
		c->conn_flags |= (cp->will_param.qos << 3) & LMQCFT_WILL_QOS_MASK;
		c->conn_flags |= (!!cp->will_param.retain) * LMQCFT_WILL_RETAIN;
	}

	if (cp->username &&
	    *cp->username) {
		c->username = lws_mqtt_str_create_cstr_dup(cp->username, 0);
		if (!c->username)
			goto oom3;
		c->conn_flags |= LMQCFT_USERNAME;
		if (cp->password) {
			c->password =
				lws_mqtt_str_create_cstr_dup(cp->password, 0);
			if (!c->password)
				goto oom4;
			c->conn_flags |= LMQCFT_PASSWORD;
		}
	}

	return 0;
oom4:
	lws_mqtt_str_free(&c->username);
oom3:
	lws_mqtt_str_free(&c->will.message);
oom2:
	lws_mqtt_str_free(&c->will.topic);
oom1:
	lws_mqtt_str_free(&c->id);
oom:
	lwsl_err("%s: OOM!\n", __func__);
	return 1;
}